

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_TextRange_resizeT(ImVector_TextRange *self,int new_size,TextRange v)

{
  int iVar1;
  ImGuiTextRange *pIVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    if (iVar5 <= new_size) {
      iVar5 = new_size;
    }
    if (iVar1 < iVar5) {
      pIVar2 = (ImGuiTextRange *)ImGui::MemAlloc((long)iVar5 << 4);
      if (self->Data != (ImGuiTextRange *)0x0) {
        memcpy(pIVar2,self->Data,(long)self->Size << 4);
        ImGui::MemFree(self->Data);
      }
      self->Data = pIVar2;
      self->Capacity = iVar5;
    }
  }
  iVar1 = self->Size;
  if (iVar1 < new_size) {
    lVar4 = (long)new_size - (long)iVar1;
    uVar3 = (long)iVar1 << 4 | 8;
    do {
      pIVar2 = self->Data;
      *(char **)((long)pIVar2 + (uVar3 - 8)) = v.b;
      *(char **)((long)&pIVar2->b + uVar3) = v.e;
      uVar3 = uVar3 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_TextRange_resizeT(ImVector_TextRange* self,int new_size,const TextRange v)
{
    return self->resize(new_size,v);
}